

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O3

bool test_uintwide_t_edge::test_various_edge_operations(void)

{
  int *piVar1;
  int *piVar2;
  char *pcVar3;
  uint uVar4;
  size_type *psVar5;
  size_type sVar6;
  ulong uVar7;
  enable_if_t<std::is_integral<unsigned_int>::value,_bool> eVar8;
  int iVar9;
  pointer pvVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  uint uVar12;
  long lVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  undefined8 uVar18;
  uint *__dest;
  size_t __n;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  local_uint_type one_limb_effs_prior_to_half_and_zeros_local;
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  u_max_local;
  local_uint_type u_mid_local;
  local_uint_type u_three_quarter_effs_and_zeros_local;
  string str_one_quarter_effs_and_zeros;
  string str_three_quarter_effs_and_zeros;
  local_uint_type u_one_quarter_effs_and_zeros_local;
  local_uint_type u_seven_and_effs_local;
  string str_seven_and_effs;
  number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  result_8;
  boost_uint_type result_boost;
  boost_uint_type u_three_quarter_effs_and_zeros_boost;
  boost_uint_type u_one_quarter_effs_and_zeros_boost;
  number_type u_max_boost;
  boost_uint_type u_mid_boost;
  boost_uint_type one_limb_effs_prior_to_half_and_zeros_boost;
  boost_uint_type u_seven_and_effs_boost;
  uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> local_5a08;
  byte local_59ee;
  byte local_59ed;
  undefined4 local_59ec;
  undefined4 local_59e8;
  undefined4 local_59e4;
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> local_59e0;
  uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_> local_59c8;
  type local_59b0;
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  local_5998;
  size_type *local_5980;
  size_type local_5978;
  size_type local_5970;
  undefined8 uStack_5968;
  size_type *local_5960;
  size_type local_5958;
  size_type local_5950;
  undefined8 uStack_5948;
  uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> local_5940;
  uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> local_5928;
  size_type *local_5910;
  size_type local_5908;
  size_type local_5900;
  undefined8 uStack_58f8;
  int local_58ec;
  undefined1 local_58e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_58d8 [127];
  limb_type local_50e8;
  undefined1 local_50d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_50c8 [127];
  limb_type local_48d8;
  long local_48c8 [256];
  undefined8 local_40c8;
  undefined1 local_40b8 [2048];
  limb_type local_38b8;
  undefined1 local_38a8 [2048];
  limb_type local_30a8;
  data_type local_3098;
  ulong local_2898;
  data_type local_2888;
  undefined8 local_2088;
  cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
  local_2078;
  type local_1868;
  data_type local_1058;
  undefined8 local_858;
  data_type local_848;
  undefined8 local_48;
  
  std::
  numeric_limits<boost::multiprecision::number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>_>
  ::max();
  memcpy(&local_3098,&DAT_001c5710,0x810);
  local_5a08.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>._8_8_ = 0x200;
  local_5a08.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems =
       (pointer)operator_new(0x800);
  local_5a08.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
  _vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_002087a8;
  memset(local_5a08.values.
         super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems,0,
         0x800);
  memset(local_48c8,0,0x800);
  local_40c8 = 1;
  aaStack_58d8[0]._M_allocated_capacity = (pointer)0x0;
  local_58e8._0_8_ = &PTR__dynamic_array_002087f0;
  local_58e8._8_8_ = 0x200;
  pvVar10 = (pointer)operator_new(0x800);
  uVar12 = local_58e8._8_4_;
  aaStack_58d8[0]._0_8_ = pvVar10;
  if ((local_58e8._8_8_ & 0xffffffff) != 0) {
    memset(pvVar10,0,(local_58e8._8_8_ & 0xffffffff) * 4);
  }
  local_58e8._0_8_ = &PTR__dynamic_array_002087a8;
  memset(pvVar10,0,0x800);
  if (local_59c8.m_value.values.
      super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count
      < uVar12) {
    uVar12 = local_59c8.m_value.values.
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elem_count;
  }
  if (uVar12 != 0) {
    lVar13 = 0;
    do {
      *(undefined4 *)((long)pvVar10 + lVar13) =
           *(undefined4 *)
            ((long)local_59c8.m_value.values.
                   super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                   .elems + lVar13);
      lVar13 = lVar13 + 4;
    } while ((ulong)uVar12 * 4 != lVar13);
  }
  math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
  operator*=((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)local_58e8,
             &local_59c8.m_value);
  pvVar10 = local_5a08.values.
            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
  ;
  sVar6 = local_5a08.values.
          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
          elem_count;
  uVar15 = local_5a08.values.
           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>._8_8_
           & 0xffffffff;
  local_5a08.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count =
       local_58e8._8_4_;
  local_58e8._8_4_ = sVar6;
  local_5a08.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems =
       (pointer)aaStack_58d8[0]._0_8_;
  aaStack_58d8[0]._M_allocated_capacity = pvVar10;
  local_58e8._0_8_ = &PTR__dynamic_array_002087f0;
  if (uVar15 != 0) {
    operator_delete(pvVar10,uVar15 << 2);
  }
  memset((cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
          *)local_58e8,0,0x800);
  local_50e8 = 1;
  boost::multiprecision::backends::
  eval_multiply<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
            ((cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)local_58e8,
             (cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)&local_3098,
             (cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)&local_3098);
  memcpy(local_48c8,local_58e8,0x808);
  math::wide_integer::uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false>::
  uintwide_t<unsigned_long>(unsigned_long,std::enable_if<(std::is_integral<unsigned_long>::
  value&&std::is_unsigned<unsigned_long>::value)&&((std::numeric_limits<unsigned_long>::digits>std::
  numeric_limits<unsigned_int>::digits)),void>::type__
            (local_58e8,1,
             (enable_if_t<(std::is_integral<unsigned_long>::value_&&_std::is_unsigned<unsigned_long>::value_&&_(std::numeric_limits<unsigned_long>::digits_>_std__numeric_limits<limb_type>__digits__>
              *)0x0);
  lVar13 = 0x7fc;
  do {
    if (lVar13 == -4) {
      bVar20 = true;
      if ((int)local_40c8 == 1) {
        bVar20 = local_48c8[0] != 1;
      }
      goto LAB_0011045b;
    }
    piVar1 = (int *)((long)local_5a08.values.
                           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                           .elems + lVar13);
    piVar2 = (int *)(aaStack_58d8[0]._M_allocated_capacity + lVar13);
    lVar13 = lVar13 + -4;
  } while (*piVar1 == *piVar2);
  bVar20 = true;
LAB_0011045b:
  local_58e8._0_8_ = &PTR__dynamic_array_002087f0;
  if ((local_58e8._8_8_ & 0xffffffff) != 0) {
    operator_delete((void *)aaStack_58d8[0]._0_8_,(local_58e8._8_8_ & 0xffffffff) << 2);
  }
  aaStack_50c8[0]._M_allocated_capacity = (pointer)0x0;
  local_50d8._0_8_ = &PTR__dynamic_array_002087f0;
  local_50d8._8_8_ = 0x200;
  pvVar10 = (pointer)operator_new(0x800);
  aaStack_50c8[0]._0_8_ = pvVar10;
  if ((local_50d8._8_8_ & 0xffffffff) != 0) {
    memset(pvVar10,0,(local_50d8._8_8_ & 0xffffffff) << 2);
  }
  local_50d8._0_8_ = &PTR__dynamic_array_002087a8;
  memset(pvVar10,0,0x800);
  local_1058.m_data[0] = 1;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,unsigned_long>
            ((uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_> *)local_50d8,
             &local_59c8,local_1058.m_data);
  aaStack_58d8[0]._M_allocated_capacity = (pointer)0x0;
  local_58e8._0_8_ = &PTR__dynamic_array_002087f0;
  local_58e8._8_8_ = 0x200;
  pvVar10 = (pointer)operator_new(0x800);
  uVar12 = local_58e8._8_4_;
  aaStack_58d8[0]._0_8_ = pvVar10;
  if ((local_58e8._8_8_ & 0xffffffff) != 0) {
    memset(pvVar10,0,(local_58e8._8_8_ & 0xffffffff) * 4);
  }
  local_58e8._0_8_ = &PTR__dynamic_array_002087a8;
  memset(pvVar10,0,0x800);
  if ((uint)local_50d8._8_4_ < uVar12) {
    uVar12 = local_50d8._8_4_;
  }
  if (uVar12 != 0) {
    lVar13 = 0;
    do {
      *(undefined4 *)((long)pvVar10 + lVar13) =
           *(undefined4 *)(aaStack_50c8[0]._M_allocated_capacity + lVar13);
      lVar13 = lVar13 + 4;
    } while ((ulong)uVar12 * 4 != lVar13);
  }
  math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
  operator*=((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)local_58e8,
             &local_59c8.m_value);
  pvVar10 = local_5a08.values.
            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
  ;
  sVar6 = local_5a08.values.
          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
          elem_count;
  uVar15 = local_5a08.values.
           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>._8_8_
           & 0xffffffff;
  local_5a08.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count =
       local_58e8._8_4_;
  local_58e8._8_4_ = sVar6;
  local_5a08.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems =
       (pointer)aaStack_58d8[0]._0_8_;
  aaStack_58d8[0]._M_allocated_capacity = pvVar10;
  local_58e8._0_8_ = &PTR__dynamic_array_002087f0;
  if (uVar15 != 0) {
    operator_delete(pvVar10,uVar15 << 2);
  }
  local_50d8._0_8_ = &PTR__dynamic_array_002087f0;
  if ((local_50d8._8_8_ & 0xffffffff) != 0) {
    operator_delete((void *)aaStack_50c8[0]._0_8_,(local_50d8._8_8_ & 0xffffffff) << 2);
  }
  memset(local_50d8,0,0x800);
  local_48d8 = 0x100;
  if ((uint)local_2898 < 0x100) {
    local_48d8 = local_2898 & 0xffffffff;
  }
  if (local_3098.m_data[0] == 0) {
    if ((uint)local_2898 == 1) {
      local_50d8._0_8_ = (_func_int **)0x1;
      boost::multiprecision::backends::
      cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
      ::negate((cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
                *)local_50d8);
    }
    else {
      local_50d8._0_8_ = (_func_int **)0xffffffffffffffff;
      uVar15 = 1;
      if (local_3098.m_data[1] == 0) {
        uVar17 = uVar15;
        uVar7 = 2;
        do {
          uVar15 = uVar7;
          *(undefined8 *)(local_50d8 + uVar17 * 8) = 0xffffffffffffffff;
          local_3098.m_data[1] = *(limb_type *)((long)&local_3098 + uVar15 * 8);
          uVar12 = (int)uVar15 + 1;
          uVar17 = uVar15;
          uVar7 = (ulong)uVar12;
        } while (local_3098.m_data[1] == 0);
        uVar17 = (ulong)uVar12;
      }
      else {
        uVar17 = 2;
      }
      *(limb_type *)(local_50d8 + uVar15 * 8) = local_3098.m_data[1] - 1;
      lVar13 = (local_2898 & 0xffffffff) - uVar17;
      if (lVar13 != 0) {
        memcpy(local_50d8 + uVar17 * 8,(void *)((long)&local_3098 + uVar17 * 8),lVar13 * 8);
      }
      while ((uVar15 = local_48d8 - 1, uVar15 != 0 && (*(long *)(local_50d8 + uVar15 * 8) == 0))) {
        local_48d8 = uVar15;
      }
    }
  }
  else {
    local_50d8._0_8_ = local_3098.m_data[0] - 1;
    if ((local_2898 & 0xffffffff) != 1) {
      memcpy(local_50d8 + 8,local_3098.m_data + 1,(local_2898 & 0xffffffff) * 8 - 8);
    }
  }
  memset((cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
          *)local_58e8,0,0x800);
  local_50e8 = 1;
  boost::multiprecision::backends::
  eval_multiply<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
            ((cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)local_58e8,
             (cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)local_50d8,
             (cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)&local_3098);
  memcpy(local_48c8,local_58e8,0x808);
  math::wide_integer::uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false>::
  uintwide_t<unsigned_long>(unsigned_long,std::enable_if<(std::is_integral<unsigned_long>::
  value&&std::is_unsigned<unsigned_long>::value)&&((std::numeric_limits<unsigned_long>::digits>std::
  numeric_limits<unsigned_int>::digits)),void>::type__
            (local_58e8,2,
             (enable_if_t<(std::is_integral<unsigned_long>::value_&&_std::is_unsigned<unsigned_long>::value_&&_(std::numeric_limits<unsigned_long>::digits_>_std__numeric_limits<limb_type>__digits__>
              *)0x0);
  lVar13 = 0x7fc;
  do {
    if (lVar13 == -4) {
      bVar19 = true;
      if ((int)local_40c8 == 1) {
        bVar19 = local_48c8[0] != 2;
      }
      goto LAB_0011074b;
    }
    piVar1 = (int *)((long)local_5a08.values.
                           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                           .elems + lVar13);
    piVar2 = (int *)(aaStack_58d8[0]._M_allocated_capacity + lVar13);
    lVar13 = lVar13 + -4;
  } while (*piVar1 == *piVar2);
  bVar19 = true;
LAB_0011074b:
  local_58e8._0_8_ = &PTR__dynamic_array_002087f0;
  if ((local_58e8._8_8_ & 0xffffffff) != 0) {
    operator_delete((void *)aaStack_58d8[0]._0_8_,(local_58e8._8_8_ & 0xffffffff) << 2);
  }
  local_58e8._0_8_ = local_58e8 + 0x10;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58e8,0xfff,
             'F');
  pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_58e8,0,0,"0x7",3);
  local_5910 = &local_5900;
  psVar5 = (size_type *)(pbVar11->_M_dataplus)._M_p;
  paVar14 = &pbVar11->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5 == paVar14) {
    local_5900 = paVar14->_M_allocated_capacity;
    uStack_58f8 = *(undefined8 *)((long)&pbVar11->field_2 + 8);
  }
  else {
    local_5900 = paVar14->_M_allocated_capacity;
    local_5910 = psVar5;
  }
  local_5908 = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar11->_M_string_length = 0;
  (pbVar11->field_2)._M_local_buf[0] = '\0';
  if ((undefined1 *)local_58e8._0_8_ != local_58e8 + 0x10) {
    operator_delete((void *)local_58e8._0_8_,aaStack_58d8[0]._M_allocated_capacity + 1);
  }
  math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
  uintwide_t(&local_5928,(char *)local_5910);
  psVar5 = local_5910;
  memset(&local_1058,0,0x800);
  local_858 = 1;
  boost::multiprecision::backends::
  cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
  ::do_assign_string((cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
                      *)&local_1058,(char *)psVar5,(false_ *)local_58e8);
  aaStack_58d8[0]._M_allocated_capacity = (pointer)0x0;
  local_58e8._0_8_ = &PTR__dynamic_array_002087f0;
  local_58e8._8_8_ = 0x200;
  pvVar10 = (pointer)operator_new(0x800);
  uVar12 = local_58e8._8_4_;
  aaStack_58d8[0]._0_8_ = pvVar10;
  if ((local_58e8._8_8_ & 0xffffffff) != 0) {
    memset(pvVar10,0,(local_58e8._8_8_ & 0xffffffff) * 4);
  }
  local_58e8._0_8_ = &PTR__dynamic_array_002087a8;
  memset(pvVar10,0,0x800);
  if (local_5928.values.
      super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count
      < uVar12) {
    uVar12 = local_5928.values.
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elem_count;
  }
  if (uVar12 != 0) {
    lVar13 = 0;
    do {
      *(undefined4 *)((long)pvVar10 + lVar13) =
           *(undefined4 *)
            ((long)local_5928.values.
                   super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                   .elems + lVar13);
      lVar13 = lVar13 + 4;
    } while ((ulong)uVar12 * 4 != lVar13);
  }
  math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
  operator*=((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)local_58e8,
             &local_5928);
  pvVar10 = local_5a08.values.
            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
  ;
  sVar6 = local_5a08.values.
          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
          elem_count;
  uVar15 = local_5a08.values.
           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>._8_8_
           & 0xffffffff;
  local_5a08.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count =
       local_58e8._8_4_;
  local_58e8._8_4_ = sVar6;
  local_5a08.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems =
       (pointer)aaStack_58d8[0]._0_8_;
  aaStack_58d8[0]._M_allocated_capacity = pvVar10;
  local_58e8._0_8_ = &PTR__dynamic_array_002087f0;
  if (uVar15 != 0) {
    operator_delete(pvVar10,uVar15 << 2);
  }
  memset((cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
          *)local_58e8,0,0x800);
  local_50e8 = 1;
  boost::multiprecision::backends::
  eval_multiply<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
            ((cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)local_58e8,
             (cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)&local_1058,
             (cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)&local_1058);
  memcpy(local_48c8,local_58e8,0x808);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58e8,
             &local_5a08);
  pbVar11 = boost::multiprecision::
            number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
            ::convert_to<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_50d8,local_48c8);
  uVar18 = local_50d8._0_8_;
  if (local_58e8._8_8_ == local_50d8._8_8_) {
    if (local_58e8._8_8_ == 0) {
      local_59e4 = 0;
    }
    else {
      iVar9 = bcmp((void *)local_58e8._0_8_,(void *)local_50d8._0_8_,local_58e8._8_8_);
      local_59e4 = CONCAT31((int3)((uint)iVar9 >> 8),iVar9 != 0);
    }
  }
  else {
    local_59e4 = (undefined4)CONCAT71((int7)((ulong)pbVar11 >> 8),1);
  }
  if ((undefined1 *)uVar18 != local_50d8 + 0x10) {
    operator_delete((void *)uVar18,aaStack_50c8[0]._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_58e8._0_8_ != local_58e8 + 0x10) {
    operator_delete((void *)local_58e8._0_8_,aaStack_58d8[0]._M_allocated_capacity + 1);
  }
  local_50d8._0_8_ = local_50d8 + 0x10;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50d8,0x3000,
             'F');
  pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_50d8,0,0,"0x",2);
  local_58e8._0_8_ = (pbVar11->_M_dataplus)._M_p;
  paVar14 = &pbVar11->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58e8._0_8_ == paVar14) {
    aaStack_58d8[0]._0_8_ = paVar14->_M_allocated_capacity;
    aaStack_58d8[0]._8_8_ = *(limb_type *)((long)&pbVar11->field_2 + 8);
    local_58e8._0_8_ = local_58e8 + 0x10;
  }
  else {
    aaStack_58d8[0]._0_8_ = paVar14->_M_allocated_capacity;
  }
  local_58e8._8_8_ = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar11->_M_string_length = 0;
  (pbVar11->field_2)._M_local_buf[0] = '\0';
  pcVar3 = local_40b8 + 0x10;
  local_40b8._0_8_ = pcVar3;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40b8,0x1000,
             '0');
  uVar18 = (pointer)0xf;
  if ((undefined1 *)local_58e8._0_8_ != local_58e8 + 0x10) {
    uVar18 = aaStack_58d8[0]._M_allocated_capacity;
  }
  if ((ulong)uVar18 < (pointer)(local_40b8._8_8_ + local_58e8._8_8_)) {
    pvVar10 = (pointer)0xf;
    if ((char *)local_40b8._0_8_ != pcVar3) {
      pvVar10 = (pointer)local_40b8._16_8_;
    }
    if (pvVar10 < (pointer)(local_40b8._8_8_ + local_58e8._8_8_)) goto LAB_00110b9f;
    pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_40b8,0,0,(char *)local_58e8._0_8_,local_58e8._8_8_);
  }
  else {
LAB_00110b9f:
    pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_58e8,(char *)local_40b8._0_8_,local_40b8._8_8_);
  }
  local_5960 = &local_5950;
  psVar5 = (size_type *)(pbVar11->_M_dataplus)._M_p;
  paVar14 = &pbVar11->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5 == paVar14) {
    local_5950 = paVar14->_M_allocated_capacity;
    uStack_5948 = *(undefined8 *)((long)&pbVar11->field_2 + 8);
  }
  else {
    local_5950 = paVar14->_M_allocated_capacity;
    local_5960 = psVar5;
  }
  local_5958 = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar11->_M_string_length = 0;
  paVar14->_M_local_buf[0] = '\0';
  if ((char *)local_40b8._0_8_ != pcVar3) {
    operator_delete((void *)local_40b8._0_8_,local_40b8._16_8_ + 1);
  }
  if ((undefined1 *)local_58e8._0_8_ != local_58e8 + 0x10) {
    operator_delete((void *)local_58e8._0_8_,aaStack_58d8[0]._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_50d8._0_8_ != local_50d8 + 0x10) {
    operator_delete((void *)local_50d8._0_8_,aaStack_50c8[0]._M_allocated_capacity + 1);
  }
  math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
  uintwide_t((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)&local_5998,
             (char *)local_5960);
  psVar5 = local_5960;
  memset((cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
          *)local_40b8,0,0x800);
  local_38b8 = 1;
  boost::multiprecision::backends::
  cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
  ::do_assign_string((cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
                      *)local_40b8,(char *)psVar5,(false_ *)local_58e8);
  aaStack_58d8[0]._M_allocated_capacity = (pointer)0x0;
  local_58e8._0_8_ = &PTR__dynamic_array_002087f0;
  local_58e8._8_8_ = 0x200;
  pvVar10 = (pointer)operator_new(0x800);
  uVar12 = local_58e8._8_4_;
  aaStack_58d8[0]._0_8_ = pvVar10;
  if ((local_58e8._8_8_ & 0xffffffff) != 0) {
    memset(pvVar10,0,(local_58e8._8_8_ & 0xffffffff) * 4);
  }
  local_58e8._0_8_ = &PTR__dynamic_array_002087a8;
  memset(pvVar10,0,0x800);
  if (local_5998.m_backend.m_value.values.
      super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count
      < uVar12) {
    uVar12 = local_5998.m_backend.m_value.values.
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elem_count;
  }
  if (uVar12 != 0) {
    lVar13 = 0;
    do {
      *(undefined4 *)((long)pvVar10 + lVar13) =
           *(undefined4 *)
            ((long)local_5998.m_backend.m_value.values.
                   super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                   .elems + lVar13);
      lVar13 = lVar13 + 4;
    } while ((ulong)uVar12 * 4 != lVar13);
  }
  math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
  operator*=((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)local_58e8,
             (uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)&local_5998);
  pvVar10 = local_5a08.values.
            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
  ;
  sVar6 = local_5a08.values.
          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
          elem_count;
  uVar15 = local_5a08.values.
           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>._8_8_
           & 0xffffffff;
  local_5a08.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count =
       local_58e8._8_4_;
  local_58e8._8_4_ = sVar6;
  local_5a08.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems =
       (pointer)aaStack_58d8[0]._0_8_;
  aaStack_58d8[0]._M_allocated_capacity = pvVar10;
  local_58e8._0_8_ = &PTR__dynamic_array_002087f0;
  if (uVar15 != 0) {
    operator_delete(pvVar10,uVar15 << 2);
  }
  memset((cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
          *)local_58e8,0,0x800);
  local_50e8 = 1;
  boost::multiprecision::backends::
  eval_multiply<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
            ((cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)local_58e8,
             (cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)local_40b8,
             (cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)local_40b8);
  memcpy(local_48c8,local_58e8,0x808);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58e8,
             &local_5a08);
  pbVar11 = boost::multiprecision::
            number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
            ::convert_to<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_50d8,local_48c8);
  uVar18 = local_50d8._0_8_;
  if (local_58e8._8_8_ == local_50d8._8_8_) {
    if (local_58e8._8_8_ == 0) {
      local_59e8 = 0;
    }
    else {
      iVar9 = bcmp((void *)local_58e8._0_8_,(void *)local_50d8._0_8_,local_58e8._8_8_);
      local_59e8 = CONCAT31((int3)((uint)iVar9 >> 8),iVar9 != 0);
    }
  }
  else {
    local_59e8 = (undefined4)CONCAT71((int7)((ulong)pbVar11 >> 8),1);
  }
  if ((undefined1 *)uVar18 != local_50d8 + 0x10) {
    operator_delete((void *)uVar18,aaStack_50c8[0]._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_58e8._0_8_ != local_58e8 + 0x10) {
    operator_delete((void *)local_58e8._0_8_,aaStack_58d8[0]._M_allocated_capacity + 1);
  }
  local_50d8._0_8_ = local_50d8 + 0x10;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50d8,0x1000,
             'F');
  pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_50d8,0,0,"0x",2);
  local_58e8._0_8_ = (pbVar11->_M_dataplus)._M_p;
  paVar14 = &pbVar11->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58e8._0_8_ == paVar14) {
    aaStack_58d8[0]._0_8_ = paVar14->_M_allocated_capacity;
    aaStack_58d8[0]._8_8_ = *(limb_type *)((long)&pbVar11->field_2 + 8);
    local_58e8._0_8_ = local_58e8 + 0x10;
  }
  else {
    aaStack_58d8[0]._0_8_ = paVar14->_M_allocated_capacity;
  }
  local_58e8._8_8_ = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar11->_M_string_length = 0;
  (pbVar11->field_2)._M_local_buf[0] = '\0';
  pcVar3 = local_38a8 + 0x10;
  local_38a8._0_8_ = pcVar3;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38a8,0x3000,
             '0');
  uVar18 = (pointer)0xf;
  if ((undefined1 *)local_58e8._0_8_ != local_58e8 + 0x10) {
    uVar18 = aaStack_58d8[0]._M_allocated_capacity;
  }
  if ((ulong)uVar18 < (pointer)(local_38a8._8_8_ + local_58e8._8_8_)) {
    pvVar10 = (pointer)0xf;
    if ((char *)local_38a8._0_8_ != pcVar3) {
      pvVar10 = (pointer)local_38a8._16_8_;
    }
    if ((pointer)(local_38a8._8_8_ + local_58e8._8_8_) <= pvVar10) {
      pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_38a8,0,0,(char *)local_58e8._0_8_,local_58e8._8_8_);
      goto LAB_00110fec;
    }
  }
  pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_58e8,(char *)local_38a8._0_8_,local_38a8._8_8_);
LAB_00110fec:
  local_5980 = &local_5970;
  psVar5 = (size_type *)(pbVar11->_M_dataplus)._M_p;
  paVar14 = &pbVar11->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5 == paVar14) {
    local_5970 = paVar14->_M_allocated_capacity;
    uStack_5968 = *(undefined8 *)((long)&pbVar11->field_2 + 8);
  }
  else {
    local_5970 = paVar14->_M_allocated_capacity;
    local_5980 = psVar5;
  }
  local_5978 = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar11->_M_string_length = 0;
  paVar14->_M_local_buf[0] = '\0';
  if ((char *)local_38a8._0_8_ != pcVar3) {
    operator_delete((void *)local_38a8._0_8_,local_38a8._16_8_ + 1);
  }
  if ((undefined1 *)local_58e8._0_8_ != local_58e8 + 0x10) {
    operator_delete((void *)local_58e8._0_8_,aaStack_58d8[0]._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_50d8._0_8_ != local_50d8 + 0x10) {
    operator_delete((void *)local_50d8._0_8_,aaStack_50c8[0]._M_allocated_capacity + 1);
  }
  math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
  uintwide_t(&local_5940,(char *)local_5980);
  psVar5 = local_5980;
  memset((cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
          *)local_38a8,0,0x800);
  local_30a8 = 1;
  boost::multiprecision::backends::
  cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
  ::do_assign_string((cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
                      *)local_38a8,(char *)psVar5,(false_ *)local_58e8);
  aaStack_58d8[0]._M_allocated_capacity = (pointer)0x0;
  local_58e8._0_8_ = &PTR__dynamic_array_002087f0;
  local_58e8._8_8_ = 0x200;
  pvVar10 = (pointer)operator_new(0x800);
  uVar12 = local_58e8._8_4_;
  aaStack_58d8[0]._0_8_ = pvVar10;
  if ((local_58e8._8_8_ & 0xffffffff) != 0) {
    memset(pvVar10,0,(local_58e8._8_8_ & 0xffffffff) * 4);
  }
  local_58e8._0_8_ = &PTR__dynamic_array_002087a8;
  memset(pvVar10,0,0x800);
  if (local_5940.values.
      super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count
      < uVar12) {
    uVar12 = local_5940.values.
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elem_count;
  }
  if (uVar12 != 0) {
    lVar13 = 0;
    do {
      *(undefined4 *)((long)pvVar10 + lVar13) =
           *(undefined4 *)
            ((long)local_5940.values.
                   super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                   .elems + lVar13);
      lVar13 = lVar13 + 4;
    } while ((ulong)uVar12 * 4 != lVar13);
  }
  math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
  operator*=((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)local_58e8,
             &local_5940);
  pvVar10 = local_5a08.values.
            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
  ;
  sVar6 = local_5a08.values.
          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
          elem_count;
  uVar15 = local_5a08.values.
           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>._8_8_
           & 0xffffffff;
  local_5a08.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count =
       local_58e8._8_4_;
  local_58e8._8_4_ = sVar6;
  local_5a08.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems =
       (pointer)aaStack_58d8[0]._0_8_;
  aaStack_58d8[0]._M_allocated_capacity = pvVar10;
  local_58e8._0_8_ = &PTR__dynamic_array_002087f0;
  if (uVar15 != 0) {
    operator_delete(pvVar10,uVar15 << 2);
  }
  memset((cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
          *)local_58e8,0,0x800);
  local_50e8 = 1;
  boost::multiprecision::backends::
  eval_multiply<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
            ((cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)local_58e8,
             (cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)local_38a8,
             (cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)local_38a8);
  memcpy(local_48c8,local_58e8,0x808);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58e8,
             &local_5a08);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50d8,
             local_48c8);
  uVar18 = local_50d8._0_8_;
  local_59ed = bVar19;
  if (local_58e8._8_8_ == local_50d8._8_8_) {
    if (local_58e8._8_8_ == 0) {
      bVar19 = false;
    }
    else {
      iVar9 = bcmp((void *)local_58e8._0_8_,(void *)local_50d8._0_8_,local_58e8._8_8_);
      bVar19 = iVar9 != 0;
    }
  }
  else {
    bVar19 = true;
  }
  if ((undefined1 *)uVar18 != local_50d8 + 0x10) {
    operator_delete((void *)uVar18,aaStack_50c8[0]._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_58e8._0_8_ != local_58e8 + 0x10) {
    operator_delete((void *)local_58e8._0_8_,aaStack_58d8[0]._M_allocated_capacity + 1);
  }
  math::wide_integer::uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false>::
  uintwide_t<unsigned_long>(unsigned_long,std::enable_if<(std::is_integral<unsigned_long>::
  value&&std::is_unsigned<unsigned_long>::value)&&((std::numeric_limits<unsigned_long>::digits>std::
  numeric_limits<unsigned_int>::digits)),void>::type__
            (local_58e8,0xffffffff,
             (enable_if_t<(std::is_integral<unsigned_long>::value_&&_std::is_unsigned<unsigned_long>::value_&&_(std::numeric_limits<unsigned_long>::digits_>_std__numeric_limits<limb_type>__digits__>
              *)0x0);
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::dynamic_array
            (&local_59e0,
             (dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
             local_58e8);
  local_59e0._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_002087a8;
  boost::multiprecision::detail::check_shift_range<int>
            (0x1fe0,(false_ *)local_50d8,(true_ *)&local_1868);
  math::wide_integer::uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false>::
  operator<<=((uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false> *)&local_59e0,
              0x1fe0);
  local_58e8._0_8_ = &PTR__dynamic_array_002087f0;
  if ((local_58e8._8_8_ & 0xffffffff) != 0) {
    operator_delete((void *)aaStack_58d8[0]._0_8_,(local_58e8._8_8_ & 0xffffffff) << 2);
  }
  memset((number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
          *)local_58e8,0,0x800);
  local_58e8._0_8_ = (_func_int **)0xffffffff;
  local_50e8 = 1;
  local_50d8._0_4_ = 0x1fe0;
  boost::multiprecision::operator<<
            (&local_1868,
             (number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_58e8,(int *)local_50d8);
  aaStack_58d8[0]._M_allocated_capacity = (pointer)0x0;
  local_58e8._0_8_ = &PTR__dynamic_array_002087f0;
  local_58e8._8_8_ = 0x200;
  pvVar10 = (pointer)operator_new(0x800);
  uVar12 = local_58e8._8_4_;
  aaStack_58d8[0]._0_8_ = pvVar10;
  if ((local_58e8._8_8_ & 0xffffffff) != 0) {
    memset(pvVar10,0,(local_58e8._8_8_ & 0xffffffff) * 4);
  }
  local_58e8._0_8_ = &PTR__dynamic_array_002087a8;
  memset(pvVar10,0,0x800);
  if (local_59e0.elem_count < uVar12) {
    uVar12 = local_59e0.elem_count;
  }
  if (uVar12 != 0) {
    lVar13 = 0;
    do {
      *(undefined4 *)((long)pvVar10 + lVar13) = *(undefined4 *)((long)local_59e0.elems + lVar13);
      lVar13 = lVar13 + 4;
    } while ((ulong)uVar12 * 4 != lVar13);
  }
  math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
  operator*=((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)local_58e8,
             (uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)&local_59e0);
  pvVar10 = local_5a08.values.
            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
  ;
  sVar6 = local_5a08.values.
          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
          elem_count;
  uVar15 = local_5a08.values.
           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>._8_8_
           & 0xffffffff;
  local_5a08.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count =
       local_58e8._8_4_;
  local_58e8._8_4_ = sVar6;
  local_5a08.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems =
       (pointer)aaStack_58d8[0]._0_8_;
  aaStack_58d8[0]._M_allocated_capacity = pvVar10;
  local_58e8._0_8_ = &PTR__dynamic_array_002087f0;
  if (uVar15 != 0) {
    operator_delete(pvVar10,uVar15 << 2);
  }
  memset((cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
          *)local_58e8,0,0x800);
  local_50e8 = 1;
  boost::multiprecision::backends::
  eval_multiply<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
            ((cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)local_58e8,&local_1868.m_backend,&local_1868.m_backend);
  memcpy(local_48c8,local_58e8,0x808);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58e8,
             &local_5a08);
  pbVar11 = boost::multiprecision::
            number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
            ::convert_to<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_50d8,local_48c8);
  uVar18 = local_50d8._0_8_;
  if (local_58e8._8_8_ == local_50d8._8_8_) {
    if (local_58e8._8_8_ == 0) {
      local_59ec = 0;
    }
    else {
      iVar9 = bcmp((void *)local_58e8._0_8_,(void *)local_50d8._0_8_,local_58e8._8_8_);
      local_59ec = CONCAT31((int3)((uint)iVar9 >> 8),iVar9 != 0);
    }
  }
  else {
    local_59ec = (undefined4)CONCAT71((int7)((ulong)pbVar11 >> 8),1);
  }
  if ((undefined1 *)uVar18 != local_50d8 + 0x10) {
    operator_delete((void *)uVar18,aaStack_50c8[0]._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_58e8._0_8_ != local_58e8 + 0x10) {
    operator_delete((void *)local_58e8._0_8_,aaStack_58d8[0]._M_allocated_capacity + 1);
  }
  local_58e8._0_4_ = 2;
  local_59ee = bVar20;
  boost::multiprecision::operator/(&local_59b0,&local_5998,(uint *)local_58e8);
  memset(&local_2078,0,0x800);
  local_2078.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_limbs = 1;
  memset((cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
          *)local_50d8,0,0x800);
  local_50d8._0_8_ = (_func_int **)0x2;
  local_48d8 = 1;
  memset((cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
          *)local_58e8,0,0x800);
  local_50e8 = 1;
  boost::multiprecision::backends::
  divide_unsigned_helper<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>>
            (&local_2078,
             (cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)local_40b8,
             (cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)local_50d8,
             (cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)local_58e8);
  pvVar10 = local_5a08.values.
            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
  ;
  uVar12 = local_5a08.values.
           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
           elem_count;
  if (local_59b0.m_backend.m_value.values.
      super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count
      < local_5a08.values.
        super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
        elem_count) {
    uVar12 = local_59b0.m_backend.m_value.values.
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elem_count;
  }
  if (uVar12 != 0) {
    lVar13 = 0;
    do {
      *(undefined4 *)
       ((long)local_5a08.values.
              super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
              elems + lVar13) =
           *(undefined4 *)
            ((long)local_59b0.m_backend.m_value.values.
                   super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                   .elems + lVar13);
      lVar13 = lVar13 + 4;
    } while ((ulong)uVar12 * 4 != lVar13);
  }
  __dest = local_5a08.values.
           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
           + 1;
  memmove(__dest,local_5a08.values.
                 super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                 elems,0x7fc);
  *pvVar10 = 0;
  if (local_5a08.values.
      super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count
      != 1) {
    uVar12 = 0;
    do {
      uVar4 = *__dest;
      *__dest = uVar4 << 7 | uVar12;
      __dest = __dest + 1;
      uVar12 = uVar4 >> 0x19;
    } while (__dest != pvVar10 + (local_5a08.values.
                                  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                  ._8_8_ & 0xffffffff));
  }
  memset(&local_2888,0,0x800);
  local_2888.m_data[0] = 1;
  local_2088 = 1;
  local_848.m_data[0]._0_4_ = 0x27;
  boost::multiprecision::operator<<
            ((type *)local_50d8,
             (number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_2888,(int *)local_848.m_data);
  memset((cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
          *)local_58e8,0,0x800);
  local_50e8 = 1;
  boost::multiprecision::backends::
  eval_multiply<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
            ((cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)local_58e8,&local_2078,
             (cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)local_50d8);
  memcpy(local_48c8,local_58e8,0x808);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58e8,
             &local_5a08);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50d8,
             local_48c8);
  uVar18 = local_50d8._0_8_;
  if (local_58e8._8_8_ == local_50d8._8_8_) {
    if (local_58e8._8_8_ == 0) {
      bVar20 = true;
    }
    else {
      iVar9 = bcmp((void *)local_58e8._0_8_,(void *)local_50d8._0_8_,local_58e8._8_8_);
      bVar20 = iVar9 == 0;
    }
  }
  else {
    bVar20 = false;
  }
  if ((undefined1 *)uVar18 != local_50d8 + 0x10) {
    operator_delete((void *)uVar18,aaStack_50c8[0]._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_58e8._0_8_ != local_58e8 + 0x10) {
    operator_delete((void *)local_58e8._0_8_,aaStack_58d8[0]._M_allocated_capacity + 1);
  }
  uVar12 = local_5a08.values.
           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
           elem_count;
  if (local_59b0.m_backend.m_value.values.
      super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count
      < local_5a08.values.
        super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
        elem_count) {
    uVar12 = local_59b0.m_backend.m_value.values.
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elem_count;
  }
  if (uVar12 != 0) {
    lVar13 = 0;
    do {
      *(undefined4 *)
       ((long)local_5a08.values.
              super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
              elems + lVar13) =
           *(undefined4 *)
            ((long)local_59b0.m_backend.m_value.values.
                   super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                   .elems + lVar13);
      lVar13 = lVar13 + 4;
    } while ((ulong)uVar12 * 4 != lVar13);
  }
  math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
  shr<unsigned_int>(&local_5a08,0x27);
  memset(&local_848,0,0x800);
  local_848.m_data[0] = 1;
  local_48 = 1;
  local_58ec = 0x27;
  boost::multiprecision::operator<<
            ((type *)&local_2888,
             (number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_848,&local_58ec);
  memset((cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
          *)local_50d8,0,0x800);
  local_48d8 = 1;
  memset((cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
          *)local_58e8,0,0x800);
  local_50e8 = 1;
  boost::multiprecision::backends::
  divide_unsigned_helper<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>>
            ((cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)local_50d8,&local_2078,
             (cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)&local_2888,
             (cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)local_58e8);
  memcpy(local_48c8,local_50d8,0x808);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58e8,
             &local_5a08);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50d8,
             local_48c8);
  uVar18 = local_50d8._0_8_;
  if (local_58e8._8_8_ == local_50d8._8_8_) {
    if (local_58e8._8_8_ == 0) {
      bVar21 = true;
    }
    else {
      iVar9 = bcmp((void *)local_58e8._0_8_,(void *)local_50d8._0_8_,local_58e8._8_8_);
      bVar21 = iVar9 == 0;
    }
  }
  else {
    bVar21 = false;
  }
  if ((undefined1 *)uVar18 != local_50d8 + 0x10) {
    operator_delete((void *)uVar18,aaStack_50c8[0]._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_58e8._0_8_ != local_58e8 + 0x10) {
    operator_delete((void *)local_58e8._0_8_,aaStack_58d8[0]._M_allocated_capacity + 1);
  }
  local_58e8._0_8_ = &PTR__dynamic_array_002087f0;
  local_58e8._8_4_ = 0x200;
  aaStack_58d8[0]._M_allocated_capacity = (pointer)0x0;
  pvVar10 = (pointer)operator_new(0x800);
  aaStack_58d8[0]._0_8_ = pvVar10;
  if ((local_58e8._8_8_ & 0xffffffff) == 0) {
    local_58e8._0_8_ = &PTR__dynamic_array_002087a8;
    memset(pvVar10 + 1,0,0x7fc);
    *pvVar10 = 0xfffffffd;
  }
  else {
    __n = (local_58e8._8_8_ & 0xffffffff) << 2;
    memset(pvVar10,0,__n);
    local_58e8._0_8_ = &PTR__dynamic_array_002087a8;
    memset(pvVar10 + 1,0,0x7fc);
    *pvVar10 = 0xfffffffd;
    memset(pvVar10,0,__n);
  }
  local_50d8._0_8_ = local_50d8._0_8_ & 0xffffffff00000000;
  eVar8 = math::wide_integer::operator==
                    ((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                     local_58e8,(uint *)local_50d8);
  if ((local_58e8._8_8_ & 0xffffffff) != 0) {
    memset((void *)aaStack_58d8[0]._0_8_,0xff,(local_58e8._8_8_ & 0xffffffff) << 2);
  }
  math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
  limits_helper_max<false>();
  lVar13 = 0x7fc;
  do {
    lVar16 = lVar13;
    if (lVar16 == -4) break;
    lVar13 = lVar16 + -4;
  } while (*(int *)(aaStack_58d8[0]._M_allocated_capacity + lVar16) ==
           *(int *)(aaStack_50c8[0]._M_allocated_capacity + lVar16));
  local_50d8._0_8_ = &PTR__dynamic_array_002087f0;
  if ((local_50d8._8_8_ & 0xffffffff) != 0) {
    operator_delete((void *)aaStack_50c8[0]._0_8_,(local_50d8._8_8_ & 0xffffffff) << 2);
  }
  local_58e8._0_8_ = &PTR__dynamic_array_002087f0;
  if ((local_58e8._8_8_ & 0xffffffff) != 0) {
    operator_delete((void *)aaStack_58d8[0]._0_8_,(local_58e8._8_8_ & 0xffffffff) << 2);
  }
  local_59b0.m_backend.m_value.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
  _vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_002087f0;
  if ((ulong)local_59b0.m_backend.m_value.values.
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elem_count != 0) {
    operator_delete(local_59b0.m_backend.m_value.values.
                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                    .elems,(ulong)local_59b0.m_backend.m_value.values.
                                  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                  .elem_count << 2);
  }
  local_59e0._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_002087f0;
  if ((ulong)local_59e0.elem_count != 0) {
    operator_delete(local_59e0.elems,(ulong)local_59e0.elem_count << 2);
  }
  local_5940.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
  _vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_002087f0;
  if ((ulong)local_5940.values.
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elem_count != 0) {
    operator_delete(local_5940.values.
                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                    .elems,(ulong)local_5940.values.
                                  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                  .elem_count << 2);
  }
  if (local_5980 != &local_5970) {
    operator_delete(local_5980,local_5970 + 1);
  }
  local_5998.m_backend.m_value.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
  _vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_002087f0;
  if ((ulong)local_5998.m_backend.m_value.values.
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elem_count != 0) {
    operator_delete(local_5998.m_backend.m_value.values.
                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                    .elems,(ulong)local_5998.m_backend.m_value.values.
                                  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                  .elem_count << 2);
  }
  if (local_5960 != &local_5950) {
    operator_delete(local_5960,local_5950 + 1);
  }
  local_5928.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
  _vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_002087f0;
  if ((ulong)local_5928.values.
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elem_count != 0) {
    operator_delete(local_5928.values.
                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                    .elems,(ulong)local_5928.values.
                                  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                  .elem_count << 2);
  }
  if (local_5910 != &local_5900) {
    operator_delete(local_5910,local_5900 + 1);
  }
  local_5a08.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
  _vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_002087f0;
  if ((local_5a08.values.
       super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>._8_8_ &
      0xffffffff) != 0) {
    operator_delete(local_5a08.values.
                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                    .elems,(local_5a08.values.
                            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                            ._8_8_ & 0xffffffff) << 2);
  }
  local_59c8.m_value.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
  _vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_002087f0;
  if ((ulong)local_59c8.m_value.values.
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elem_count != 0) {
    operator_delete(local_59c8.m_value.values.
                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                    .elems,(ulong)local_59c8.m_value.values.
                                  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                  .elem_count << 2);
  }
  return (bool)(bVar20 & bVar21 & eVar8 & lVar16 == -4 &
               ~(bVar19 | (byte)local_59ec |
                (byte)local_59e4 | (byte)local_59e8 | local_59ee | local_59ed));
}

Assistant:

auto test_various_edge_operations() -> bool
{
  const auto u_max_local = (std::numeric_limits<local_uint_type>::max)();
  const auto u_max_boost = (std::numeric_limits<boost_uint_type>::max)();

  local_uint_type result_local;
  boost_uint_type result_boost;

  result_local = u_max_local * u_max_local;
  result_boost = u_max_boost * u_max_boost;

  const auto result01_is_ok = ((result_local == local_uint_type(static_cast<unsigned>(UINT8_C(1)))) && (result_boost == boost_uint_type(static_cast<unsigned>(UINT8_C(1)))));

  result_local = (u_max_local - 1U) * u_max_local;
  result_boost = (u_max_boost - 1U) * u_max_boost;

  const auto result02_is_ok = ((result_local == local_uint_type(static_cast<unsigned>(UINT8_C(2)))) && (result_boost == boost_uint_type(static_cast<unsigned>(UINT8_C(2)))));

  const std::string str_seven_and_effs =
    "0x7" + std::string(static_cast<std::string::size_type>((local_edge_cases::local_digits2 / 4) - static_cast<unsigned>(UINT8_C(1))), 'F');

  const local_uint_type u_seven_and_effs_local(str_seven_and_effs.c_str());
  const boost_uint_type u_seven_and_effs_boost(str_seven_and_effs.c_str());

  result_local = u_seven_and_effs_local * u_seven_and_effs_local;
  result_boost = u_seven_and_effs_boost * u_seven_and_effs_boost;

  const auto result03_is_ok = (result_local.convert_to<std::string>() == result_boost.convert_to<std::string>());

  const std::string str_three_quarter_effs_and_zeros =
      "0x"
    + std::string(static_cast<std::string::size_type>((local_edge_cases::local_digits2 / 4) * static_cast<unsigned>(UINT8_C(3))), 'F')
    + std::string(static_cast<std::string::size_type>((local_edge_cases::local_digits2 / 4) * static_cast<unsigned>(UINT8_C(1))), '0')
    ;

  const local_uint_type u_three_quarter_effs_and_zeros_local(str_three_quarter_effs_and_zeros.c_str());
  const boost_uint_type u_three_quarter_effs_and_zeros_boost(str_three_quarter_effs_and_zeros.c_str());

  result_local = u_three_quarter_effs_and_zeros_local * u_three_quarter_effs_and_zeros_local;
  result_boost = u_three_quarter_effs_and_zeros_boost * u_three_quarter_effs_and_zeros_boost;

  const auto result04_is_ok = (result_local.convert_to<std::string>() == result_boost.convert_to<std::string>());

  const std::string str_one_quarter_effs_and_zeros =
      "0x"
    + std::string(static_cast<std::string::size_type>((local_edge_cases::local_digits2 / 4) * static_cast<unsigned>(UINT8_C(1))), 'F')
    + std::string(static_cast<std::string::size_type>((local_edge_cases::local_digits2 / 4) * static_cast<unsigned>(UINT8_C(3))), '0')
    ;

  const local_uint_type u_one_quarter_effs_and_zeros_local(str_one_quarter_effs_and_zeros.c_str());
  const boost_uint_type u_one_quarter_effs_and_zeros_boost(str_one_quarter_effs_and_zeros.c_str());

  result_local = u_one_quarter_effs_and_zeros_local * u_one_quarter_effs_and_zeros_local;
  result_boost = u_one_quarter_effs_and_zeros_boost * u_one_quarter_effs_and_zeros_boost;

  const bool result05_is_ok = (result_local.convert_to<std::string>() == result_boost.convert_to<std::string>());

  const local_uint_type one_limb_effs_prior_to_half_and_zeros_local(local_uint_type(UINT32_C(0xFFFFFFFF)) << ((std::numeric_limits<local_uint_type>::digits / 2) - 32));
  const boost_uint_type one_limb_effs_prior_to_half_and_zeros_boost(boost_uint_type(UINT32_C(0xFFFFFFFF)) << ((std::numeric_limits<boost_uint_type>::digits / 2) - 32));

  result_local = one_limb_effs_prior_to_half_and_zeros_local * one_limb_effs_prior_to_half_and_zeros_local;
  result_boost = one_limb_effs_prior_to_half_and_zeros_boost * one_limb_effs_prior_to_half_and_zeros_boost;

  const auto result06_is_ok = (result_local.convert_to<std::string>() == result_boost.convert_to<std::string>());

  const local_uint_type u_mid_local = u_three_quarter_effs_and_zeros_local / static_cast<typename local_uint_type::backend_type::representation_type::limb_type>(UINT8_C(2));
  const boost_uint_type u_mid_boost = u_three_quarter_effs_and_zeros_boost / static_cast<typename std::iterator_traits<boost_uint_type::backend_type::limb_pointer>::value_type>(UINT8_C(2));

  constexpr auto signed_shift_amount =
    static_cast<int>
    (
      -(std::numeric_limits<typename local_uint_type::backend_type::representation_type::limb_type>::digits + 7)
    );

  result_local = u_mid_local;
  result_local.backend().representation() >>= signed_shift_amount;
  result_boost = u_mid_boost * (boost_uint_type(1U) << (-signed_shift_amount));

  const auto result07_is_ok = (result_local.convert_to<std::string>() == result_boost.convert_to<std::string>());

  result_local = u_mid_local;
  result_local.backend().representation() <<= signed_shift_amount;
  result_boost = u_mid_boost / (boost_uint_type(1U) << (-signed_shift_amount));

  const auto result08_is_ok = (result_local.convert_to<std::string>() == result_boost.convert_to<std::string>());

  auto result_is_ok = (   result01_is_ok
                       && result02_is_ok
                       && result03_is_ok
                       && result04_is_ok
                       && result05_is_ok
                       && result06_is_ok
                       && result07_is_ok
                       && result08_is_ok);

  {
    using local_derived_uint_type = typename local_uint_type::backend_type::representation_type;
    using local_limb_type         = local_derived_uint_type::limb_type;

    local_derived_uint_type dt(static_cast<local_limb_type>(INT8_C(-3)));

    std::fill(dt.representation().begin(), dt.representation().end(), static_cast<local_limb_type>(UINT8_C(0)));

    const auto result_fill_with_zero_is_ok = (dt == 0U);

    result_is_ok = (result_fill_with_zero_is_ok && result_is_ok);

    std::fill(dt.representation().begin(), dt.representation().end(), (std::numeric_limits<local_limb_type>::max)());

    const auto result_fill_with_effs_is_ok = (dt == (std::numeric_limits<local_derived_uint_type>::max)());

    result_is_ok = (result_fill_with_effs_is_ok && result_is_ok);
  }

  return result_is_ok;
}